

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O2

void __thiscall asmjit::v1_14::JitAllocator::reset(JitAllocator *this,ResetPolicy resetPolicy)

{
  JitAllocatorPrivateImpl *impl;
  size_t sVar1;
  JitAllocatorPool *pJVar2;
  JitAllocatorBlock *pJVar3;
  JitAllocatorPool *pJVar4;
  void *pvVar5;
  bool bVar6;
  size_t sVar7;
  JitAllocatorBlock *this_00;
  ulong uVar8;
  undefined4 in_register_00000034;
  JitAllocatorBlock *block;
  JitAllocatorBlock *impl_00;
  size_t byteSize;
  void *mem;
  size_t local_60;
  size_t rangeStart;
  BitVectorRangeIterator<unsigned_long,_0U> it;
  
  block = (JitAllocatorBlock *)CONCAT44(in_register_00000034,resetPolicy);
  impl = (JitAllocatorPrivateImpl *)this->_impl;
  if (impl != (JitAllocatorPrivateImpl *)JitAllocatorImpl_none) {
    *(undefined8 *)&impl->tree = 0;
    sVar1 = impl->poolCount;
    for (sVar7 = 0; sVar7 != sVar1; sVar7 = sVar7 + 1) {
      pJVar2 = impl->pools;
      pJVar3 = *(JitAllocatorBlock **)(pJVar2 + sVar7);
      *(undefined8 *)&pJVar2[sVar7].field_0xc = 0;
      *(undefined8 *)(&pJVar2[sVar7].field_0xc + 8) = 0;
      *(undefined8 *)(pJVar2 + sVar7) = 0;
      *(undefined8 *)&pJVar2[sVar7].field_0x8 = 0;
      pJVar2[sVar7].totalAreaSize[0] = 0;
      pJVar2[sVar7].totalAreaSize[1] = 0;
      pJVar2[sVar7].totalAreaUsed[0] = 0;
      pJVar2[sVar7].totalAreaUsed[1] = 0;
      pJVar2[sVar7].totalOverheadBytes = 0;
      if (pJVar3 != (JitAllocatorBlock *)0x0) {
        if ((resetPolicy == kHard) || (((impl->super_Impl).options & kImmediateRelease) != kNone)) {
          this_00 = (JitAllocatorBlock *)0x0;
          impl_00 = pJVar3;
        }
        else {
          impl_00 = *(JitAllocatorBlock **)&pJVar3->field_0x18;
          this_00 = pJVar3;
        }
        while (impl_00 != (JitAllocatorBlock *)0x0) {
          pJVar3 = *(JitAllocatorBlock **)&impl_00->field_0x18;
          JitAllocatorImpl_deleteBlock((JitAllocatorPrivateImpl *)impl_00,block);
          impl_00 = pJVar3;
        }
        if (this_00 != (JitAllocatorBlock *)0x0) {
          *(undefined8 *)&this_00->super_ZoneListNode<asmjit::v1_14::JitAllocatorBlock> = 0;
          *(undefined8 *)&this_00->field_0x18 = 0;
          if ((this_00->_flags & 2) == 0) {
            if (((impl->super_Impl).options & kFillUnusedMemory) != kNone) {
              pJVar4 = this_00->_pool;
              VirtMem::protectJitMemory(kReadWrite);
              uVar8 = (ulong)pJVar4->granularity;
              pvVar5 = (this_00->_mapping).rw;
              BitVectorRangeIterator<unsigned_long,_0U>::init
                        (&it,(EVP_PKEY_CTX *)this_00->_usedBitVector);
              while (bVar6 = BitVectorRangeIterator<unsigned_long,_0U>::nextRange
                                       (&it,&rangeStart,&local_60,0xffffffffffffffff), bVar6) {
                mem = (void *)(rangeStart * uVar8 + (long)pvVar5);
                byteSize = (local_60 - rangeStart) * uVar8;
                JitAllocatorImpl_fillPattern(mem,(impl->super_Impl).fillPattern,byteSize);
                VirtMem::flushInstructionCache(mem,byteSize);
              }
              VirtMem::protectJitMemory(kReadExecute);
            }
            JitAllocatorBlock::clearBlock(this_00);
          }
          JitAllocatorImpl_insertBlock(impl,this_00);
          pJVar2[sVar7].emptyBlockCount = '\x01';
          block = this_00;
        }
      }
    }
  }
  return;
}

Assistant:

void JitAllocator::reset(ResetPolicy resetPolicy) noexcept {
  if (_impl == &JitAllocatorImpl_none)
    return;

  JitAllocatorPrivateImpl* impl = static_cast<JitAllocatorPrivateImpl*>(_impl);
  impl->tree.reset();
  size_t poolCount = impl->poolCount;

  for (size_t poolId = 0; poolId < poolCount; poolId++) {
    JitAllocatorPool& pool = impl->pools[poolId];
    JitAllocatorBlock* block = pool.blocks.first();

    pool.reset();

    if (block) {
      JitAllocatorBlock* blockToKeep = nullptr;
      if (resetPolicy != ResetPolicy::kHard && uint32_t(impl->options & JitAllocatorOptions::kImmediateRelease) == 0) {
        blockToKeep = block;
        block = block->next();
      }

      while (block) {
        JitAllocatorBlock* next = block->next();
        JitAllocatorImpl_deleteBlock(impl, block);
        block = next;
      }

      if (blockToKeep) {
        blockToKeep->_listNodes[0] = nullptr;
        blockToKeep->_listNodes[1] = nullptr;
        JitAllocatorImpl_wipeOutBlock(impl, blockToKeep);
        JitAllocatorImpl_insertBlock(impl, blockToKeep);
        pool.emptyBlockCount = 1;
      }
    }
  }
}